

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O0

SoapySDRRange * SoapySDRDevice_getMasterClockRates(SoapySDRDevice *device,size_t *length)

{
  SoapySDRRange *pSVar1;
  undefined8 *in_RSI;
  long *in_RDI;
  exception *ex;
  vector<SoapySDR::Range,_std::allocator<SoapySDR::Range>_> *in_stack_ffffffffffffffc0;
  undefined1 local_30 [8];
  size_t *in_stack_ffffffffffffffd8;
  RangeList *in_stack_ffffffffffffffe0;
  
  *in_RSI = 0;
  SoapySDRDevice_clearError();
  (**(code **)(*in_RDI + 0x230))(local_30);
  pSVar1 = toRangeList(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::vector<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>::~vector(in_stack_ffffffffffffffc0)
  ;
  return pSVar1;
}

Assistant:

SoapySDRRange *SoapySDRDevice_getMasterClockRates(const SoapySDRDevice *device, size_t *length)
{
    *length = 0;
    __SOAPY_SDR_C_TRY
    return toRangeList(device->getMasterClockRates(), length);
    __SOAPY_SDR_C_CATCH_RET(nullptr);
}